

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

QWidget * QApplication::topLevelAt(QPoint *pos)

{
  long lVar1;
  QWidgetWindow *pQVar2;
  QPoint *in_RDI;
  QWidgetWindow *widgetWindow;
  QWindow *window;
  QWidget *local_8;
  
  lVar1 = QGuiApplication::topLevelAt(in_RDI);
  if ((lVar1 == 0) ||
     (pQVar2 = qobject_cast<QWidgetWindow_const*>((QObject *)0x2c821e),
     pQVar2 == (QWidgetWindow *)0x0)) {
    local_8 = (QWidget *)0x0;
  }
  else {
    local_8 = QWidgetWindow::widget((QWidgetWindow *)0x2c8235);
  }
  return local_8;
}

Assistant:

QWidget *QApplication::topLevelAt(const QPoint &pos)
{
    if (const QWindow *window = QGuiApplication::topLevelAt(pos)) {
        if (const QWidgetWindow *widgetWindow = qobject_cast<const QWidgetWindow *>(window))
            return widgetWindow->widget();
    }
    return nullptr;
}